

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall QObject::setObjectName(QObject *this,QAnyStringView name)

{
  QObjectData *pQVar1;
  QArrayData *data;
  _func_int *p_Var2;
  _func_int *p_Var3;
  bool bVar4;
  _func_int **pp_Var5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  long in_FS_OFFSET;
  QAnyStringView string;
  QAnyStringView lhs;
  QString local_48;
  long local_30;
  
  string.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)name.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  if (pQVar1[1]._vptr_QObjectData == (_func_int **)0x0) {
    pp_Var5 = (_func_int **)operator_new(0x80);
    *pp_Var5 = (_func_int *)0x0;
    pp_Var5[1] = (_func_int *)0x0;
    pp_Var5[2] = (_func_int *)0x0;
    pp_Var5[3] = (_func_int *)0x0;
    pp_Var5[4] = (_func_int *)0x0;
    pp_Var5[5] = (_func_int *)0x0;
    pp_Var5[6] = (_func_int *)0x0;
    pp_Var5[7] = (_func_int *)0x0;
    pp_Var5[8] = (_func_int *)0x0;
    pp_Var5[9] = (_func_int *)0x0;
    pp_Var5[10] = (_func_int *)0x0;
    pp_Var5[0xb] = (_func_int *)0x0;
    pp_Var5[0xc] = (_func_int *)0x0;
    pp_Var5[0xd] = (_func_int *)0x0;
    pp_Var5[0xe] = (_func_int *)0x0;
    pp_Var5[0xf] = (_func_int *)pQVar1;
    pQVar1[1]._vptr_QObjectData = pp_Var5;
  }
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
              *)(pQVar1[1]._vptr_QObjectData + 0xc));
  lhs.m_size = (ulong)pQVar1[1]._vptr_QObjectData[0xe] | 0x8000000000000000;
  lhs.field_0.m_data =
       ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(pQVar1[1]._vptr_QObjectData + 0xd))->m_data
  ;
  aVar6 = string.field_0;
  bVar4 = QAnyStringView::equal(lhs,name);
  if (!bVar4) {
    pp_Var5 = pQVar1[1]._vptr_QObjectData;
    string.m_size = (size_t)aVar6.m_data;
    QtPrivate::convertToQString(&local_48,(QtPrivate *)name.field_0.m_data_utf8,string);
    data = (QArrayData *)pp_Var5[0xc];
    p_Var2 = pp_Var5[0xd];
    pp_Var5[0xc] = (_func_int *)local_48.d.d;
    pp_Var5[0xd] = (_func_int *)local_48.d.ptr;
    p_Var3 = pp_Var5[0xe];
    pp_Var5[0xe] = (_func_int *)local_48.d.size;
    local_48.d.d = (Data *)data;
    local_48.d.ptr = (char16_t *)p_Var2;
    local_48.d.size = (qsizetype)p_Var3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
    ::notify((QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
              *)(pQVar1[1]._vptr_QObjectData + 0xc));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObject::setObjectName(QAnyStringView name)
{
    Q_D(QObject);

    d->ensureExtraData();

    d->extraData->objectName.removeBindingUnlessInWrapper();

    if (d->extraData->objectName.valueBypassingBindings() != name) {
        d->extraData->objectName.setValueBypassingBindings(name.toString());
        d->extraData->objectName.notify(); // also emits a signal
    }
}